

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

bool __thiscall jsonnet::internal::FixNewlines::shouldExpand(FixNewlines *this,Array *array)

{
  Kind KVar1;
  pointer pEVar2;
  pointer pFVar3;
  uint uVar4;
  AST *pAVar5;
  ostream *poVar6;
  FodderElement *elem_1;
  pointer pFVar7;
  int iVar8;
  int iVar9;
  Element *elem;
  pointer pEVar10;
  bool bVar11;
  
  pEVar10 = (array->elements).
            super__Vector_base<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (array->elements).
           super__Vector_base<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    bVar11 = pEVar10 == pEVar2;
    if (bVar11) {
LAB_001aed88:
      pFVar7 = (array->closeFodder).
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pFVar3 = (array->closeFodder).
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar4 = 0;
      if (pFVar7 != pFVar3) {
        do {
          KVar1 = pFVar7->kind;
          if (KVar1 == PARAGRAPH) {
            iVar8 = (int)((ulong)((long)(pFVar7->comment).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pFVar7->comment).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 5) +
                    pFVar7->blanks;
          }
          else {
            iVar8 = 0;
            if (KVar1 != INTERSTITIAL) {
              if (KVar1 != LINE_END) {
LAB_001aede0:
                poVar6 = std::operator<<((ostream *)&std::cerr,"Unknown FodderElement kind");
                std::endl<char,std::char_traits<char>>(poVar6);
                abort();
              }
              iVar8 = 1;
            }
          }
          uVar4 = uVar4 + iVar8;
          pFVar7 = pFVar7 + 1;
        } while (pFVar7 != pFVar3);
        uVar4 = (uint)(0 < (int)uVar4);
      }
LAB_001aedd5:
      return SUB41(uVar4,0);
    }
    pAVar5 = left_recursive_deep(pEVar10->expr);
    pFVar7 = (pAVar5->openFodder).
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pFVar3 = (pAVar5->openFodder).
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pFVar7 != pFVar3) {
      iVar8 = 0;
      do {
        KVar1 = pFVar7->kind;
        if (KVar1 == PARAGRAPH) {
          iVar9 = (int)((ulong)((long)(pFVar7->comment).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pFVar7->comment).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5) +
                  pFVar7->blanks;
        }
        else {
          iVar9 = 0;
          if (KVar1 != INTERSTITIAL) {
            if (KVar1 != LINE_END) goto LAB_001aede0;
            iVar9 = 1;
          }
        }
        iVar8 = iVar8 + iVar9;
        pFVar7 = pFVar7 + 1;
      } while (pFVar7 != pFVar3);
      if (0 < iVar8) {
        uVar4 = 1;
        if (!bVar11) goto LAB_001aedd5;
        goto LAB_001aed88;
      }
    }
    pEVar10 = pEVar10 + 1;
  } while( true );
}

Assistant:

bool shouldExpand(const Array *array)
    {
        for (const auto &elem : array->elements) {
            if (countNewlines(open_fodder(elem.expr)) > 0) {
                return true;
            }
        }
        if (countNewlines(array->closeFodder) > 0) {
            return true;
        }
        return false;
    }